

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakMap.cpp
# Opt level: O0

WeakMapKeyMap * __thiscall
Js::JavascriptWeakMap::GetWeakMapKeyMapFromKey(JavascriptWeakMap *this,RecyclableObject *key)

{
  code *pcVar1;
  Var pvVar2;
  bool bVar3;
  TypeId typeId_00;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  ScriptContext *pSVar7;
  JavascriptLibrary *this_00;
  JavascriptWeakMap *pJVar8;
  JavascriptWeakMap *local_38;
  Var weakMapKeyData;
  RecyclableObject *key_local;
  JavascriptWeakMap *this_local;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId;
  
  weakMapKeyData = key;
  key_local = (RecyclableObject *)this;
  typeId_00 = RecyclableObject::GetTypeId(key);
  bVar3 = DynamicType::Is(typeId_00);
  if (!bVar3) {
    pRStack_10 = (RecyclableObject *)weakMapKeyData;
    if (weakMapKeyData == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    local_14 = RecyclableObject::GetTypeId(pRStack_10);
    if (0x57 < (int)local_14) {
      BVar4 = RecyclableObject::IsExternal(pRStack_10);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
    if (local_14 != TypeIds_HostDispatch) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptWeakMap.cpp"
                                  ,0x11,
                                  "(DynamicType::Is(key->GetTypeId()) || JavascriptOperators::GetTypeId(key) == TypeIds_HostDispatch)"
                                  ,
                                  "DynamicType::Is(key->GetTypeId()) || JavascriptOperators::GetTypeId(key) == TypeIds_HostDispatch"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  pvVar2 = weakMapKeyData;
  local_38 = (JavascriptWeakMap *)0x0;
  pSVar7 = RecyclableObject::GetScriptContext((RecyclableObject *)weakMapKeyData);
  iVar5 = (**(code **)(*pvVar2 + 0xa0))(pvVar2,pvVar2,7,&local_38,0,pSVar7);
  if (iVar5 == 0) {
    this_local = (JavascriptWeakMap *)0x0;
  }
  else {
    this_00 = RecyclableObject::GetLibrary((RecyclableObject *)weakMapKeyData);
    pJVar8 = (JavascriptWeakMap *)
             JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
    if (pJVar8 == local_38) {
      this_local = (JavascriptWeakMap *)0x0;
    }
    else {
      this_local = local_38;
    }
  }
  return (WeakMapKeyMap *)this_local;
}

Assistant:

JavascriptWeakMap::WeakMapKeyMap* JavascriptWeakMap::GetWeakMapKeyMapFromKey(RecyclableObject* key) const
    {
        AssertOrFailFast(DynamicType::Is(key->GetTypeId()) || JavascriptOperators::GetTypeId(key) == TypeIds_HostDispatch);

        Var weakMapKeyData = nullptr;

        if (!key->GetInternalProperty(key, InternalPropertyIds::WeakMapKeyMap, &weakMapKeyData, nullptr, key->GetScriptContext()))
        {
            return nullptr;
        }

        if (key->GetLibrary()->GetUndefined() == weakMapKeyData)
        {
            return nullptr;
        }

        return static_cast<WeakMapKeyMap*>(weakMapKeyData);
    }